

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O3

__pid_t __thiscall QWaitCondition::wait(QWaitCondition *this,void *__stat_loc)

{
  int *piVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  __pid_t _Var5;
  void *in_RDX;
  pthread_mutex_t *__mutex;
  bool bVar6;
  
  bVar6 = false;
  if (__stat_loc == (void *)0x0) {
    return 0;
  }
  lVar2 = *__stat_loc;
  uVar3 = (uint)lVar2 & 3;
  if (uVar3 != 1) {
    if (uVar3 != 2) {
      if (lVar2 != 0) {
        __mutex = (pthread_mutex_t *)(lVar2 + 0x80);
        iVar4 = pthread_mutex_lock(__mutex);
        if (iVar4 != 0) {
          std::__throw_system_error(iVar4);
        }
        iVar4 = *(int *)(lVar2 + 0xac);
        bVar6 = iVar4 == 1;
        pthread_mutex_unlock(__mutex);
        if (iVar4 < 2) goto LAB_003cc456;
        wait(__mutex);
      }
      return 0;
    }
    bVar6 = true;
  }
LAB_003cc456:
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)this->d);
  if (iVar4 != 0) {
    qErrnoWarning(iVar4,"%s: %s failure","QWaitCondition::wait()","mutex lock");
  }
  piVar1 = &this->d->waiters;
  *piVar1 = *piVar1 + 1;
  QReadWriteLock::unlock((QReadWriteLock *)__stat_loc);
  _Var5 = QWaitConditionPrivate::wait(this->d,in_RDX);
  if (bVar6) {
    QReadWriteLock::lockForWrite((QReadWriteLock *)__stat_loc);
  }
  else {
    QReadWriteLock::lockForRead((QReadWriteLock *)__stat_loc);
  }
  return _Var5;
}

Assistant:

bool QWaitCondition::wait(QReadWriteLock *readWriteLock, QDeadlineTimer deadline)
{
    using namespace QReadWriteLockStates;

    if (!readWriteLock)
        return false;
    auto previousState = QReadWriteLockPrivate::stateForWaitCondition(readWriteLock);
    if (previousState == Unlocked)
        return false;
    if (previousState == RecursivelyLocked) {
        qWarning("QWaitCondition: cannot wait on QReadWriteLocks with recursive lockForWrite()");
        return false;
    }

    qt_report_pthread_error(pthread_mutex_lock(&d->mutex), "QWaitCondition::wait()", "mutex lock");
    ++d->waiters;

    readWriteLock->unlock();

    bool returnValue = d->wait(deadline);

    if (previousState == LockedForWrite)
        readWriteLock->lockForWrite();
    else
        readWriteLock->lockForRead();

    return returnValue;
}